

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvelopeForm.cpp
# Opt level: O0

void __thiscall EnvelopeForm::updateEnvelope(EnvelopeForm *this)

{
  uint8_t uVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  uint8_t oldValue;
  EnvelopeForm *this_local;
  
  if ((this->mIgnoreChanges & 1U) == 0) {
    uVar1 = this->mEnvelope;
    cVar2 = QSpinBox::value();
    bVar3 = QAbstractButton::isChecked();
    bVar4 = 0;
    if ((bVar3 & 1) != 0) {
      bVar4 = 8;
    }
    bVar3 = QSpinBox::value();
    this->mEnvelope = cVar2 << 4 | bVar4 | bVar3;
    if (uVar1 != this->mEnvelope) {
      envelopeChanged(this,this->mEnvelope);
    }
  }
  return;
}

Assistant:

void EnvelopeForm::updateEnvelope() {

    if (!mIgnoreChanges) {
        uint8_t oldValue = mEnvelope;
        mEnvelope = static_cast<uint8_t>(mInitVolumeSpin.value()) << 4 |
            static_cast<uint8_t>(mIncreasingCheckbox.isChecked() ? 0x8 : 0x0) |
            static_cast<uint8_t>(mPeriodSpin.value());
        if (oldValue != mEnvelope) {
            emit envelopeChanged(mEnvelope);
        }
    }
}